

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::ArrayPtr<const_char>::findLast(ArrayPtr<const_char> *this,char *match)

{
  unsigned_long uVar1;
  char *in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  Maybe<unsigned_long> MVar3;
  unsigned_long local_28;
  size_t i;
  char *match_local;
  ArrayPtr<const_char> *this_local;
  
  local_28 = *(unsigned_long *)(match + 8);
  do {
    uVar1 = local_28 - 1;
    match_local = match;
    this_local = this;
    if (local_28 == 0) {
      local_28 = uVar1;
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
      aVar2 = extraout_RDX_00;
      goto LAB_003e4448;
    }
    local_28 = uVar1;
  } while (*(char *)(*(long *)match + uVar1) != *in_RDX);
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_28);
  aVar2 = extraout_RDX;
LAB_003e4448:
  MVar3.ptr.field_1.value = aVar2.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

inline Maybe<size_t> findLast(const T& match) const {
    for (size_t i = size_; i--;) {
      if (ptr[i] == match) {
        return i;
      }
    }
    return kj::none;
  }